

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

char * my_strdup(char *s,size_t max_length)

{
  char *__dest;
  size_t len;
  size_t sVar1;
  size_t __n;
  long *in_FS_OFFSET;
  
  if (s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    for (sVar1 = 0;
        ((__n = max_length, max_length != sVar1 && (__n = sVar1, s[sVar1] != '\n')) &&
        (s[sVar1] != '\r')); sVar1 = sVar1 + 1) {
    }
    __dest = (char *)(*(code *)in_FS_OFFSET[-0x85])(*in_FS_OFFSET + -0x430,1);
    memcpy(__dest,s,__n);
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

static char *my_strdup(const char *s, size_t max_length) {
  char *d;
  size_t len;

  if (s == NULL) return NULL;

  /* Do not consider CRLF line ending(#19) */
  len = length_until_line_feed(s, max_length);
  /* len = strlen(s); */

  /* trim line ending and append '\0' */
  d = (char *)TINYOBJ_MALLOC(len + 1); /* + '\0' */
  memcpy(d, s, (size_t)(len));
  d[len] = '\0';

  return d;
}